

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.c
# Opt level: O3

uint8_t * pvpatch(uint8_t *p,uint32_t size,...)

{
  uint8_t *puVar1;
  ulong uVar2;
  uint8_t *puVar3;
  uint local_d8;
  uint8_t local_b8 [56];
  va_list arg;
  
  puVar1 = &stack0x00000008;
  if (size != 0) {
    local_d8 = 0x10;
    do {
      if (local_d8 < 0x29) {
        uVar2 = (ulong)local_d8;
        local_d8 = local_d8 + 8;
        puVar3 = local_b8 + uVar2;
      }
      else {
        puVar3 = puVar1;
        puVar1 = puVar1 + 8;
      }
      *p = *puVar3;
      p = p + 1;
      size = size - 1;
    } while (size != 0);
  }
  return p;
}

Assistant:

uint8_t *pvpatch(uint8_t *p, const uint32_t size, ...)
{
    uint32_t i;
    va_list arg;

    va_start(arg, size);

    for (i=0; i < size; i++) {
        *(p++) = va_arg(arg, int);
    }
    va_end(arg);
    return p;

}